

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::addDepthBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::RenderBuffer> *renderBufferIn)

{
  runtime_error *this_00;
  socklen_t in_ECX;
  int __fd;
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer> sVar1;
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer> renderBuffer;
  __shared_ptr<polyscope::render::RenderBuffer,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  __fd = (int)renderBufferIn;
  sVar1 = std::
          dynamic_pointer_cast<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,polyscope::render::RenderBuffer>
                    ((shared_ptr<polyscope::render::RenderBuffer> *)&renderBuffer);
  if (renderBuffer.
      super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    GLRenderBuffer::bind
              (renderBuffer.
               super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,__fd,
               (sockaddr *)
               sVar1.
               super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._M_pi,in_ECX);
    (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
    (*glad_glFramebufferRenderbuffer)
              (0x8d40,0x8d00,0x8d41,
               *(GLuint *)
                &((renderBuffer.
                   super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_RenderBuffer).field_0x14);
    checkGLError(true);
    std::__shared_ptr<polyscope::render::RenderBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,void>
              (local_20,&renderBuffer.
                         super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
              );
    std::
    vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
    ::emplace_back<std::shared_ptr<polyscope::render::RenderBuffer>>
              ((vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
                *)&(this->super_FrameBuffer).renderBuffersDepth,
               (shared_ptr<polyscope::render::RenderBuffer> *)local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&renderBuffer.
                super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"tried to bind to non-GL render buffer");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLFrameBuffer::addDepthBuffer(std::shared_ptr<RenderBuffer> renderBufferIn) {
  // it _better_ be a GL buffer
  std::shared_ptr<GLRenderBuffer> renderBuffer = std::dynamic_pointer_cast<GLRenderBuffer>(renderBufferIn);
  if (!renderBuffer) throw std::runtime_error("tried to bind to non-GL render buffer");

  renderBuffer->bind();
  bind();

  // Sanity checks
  // if (depthRenderBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to render buffer");
  // if (depthTextureBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to texture buffer");

  glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, renderBuffer->getHandle());
  checkGLError();
  renderBuffersDepth.push_back(renderBuffer);
}